

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O0

int https_connect(HTTP_INFO *hi,char *host,char *port)

{
  BOOL BVar1;
  int iVar2;
  uint32_t uVar3;
  int https;
  int ret;
  char *port_local;
  char *host_local;
  HTTP_INFO *hi_local;
  
  BVar1 = (hi->url).https;
  if (BVar1 == '\x01') {
    mbedtls_entropy_init(&(hi->tls).entropy);
    iVar2 = mbedtls_ctr_drbg_seed
                      (&(hi->tls).ctr_drbg,mbedtls_entropy_func,&(hi->tls).entropy,(uchar *)0x0,0);
    if (iVar2 != 0) {
      return iVar2;
    }
    ca_crt_rsa[0x112e0] = '\0';
    iVar2 = mbedtls_x509_crt_parse(&(hi->tls).cacert,(uchar *)ca_crt_rsa,0x112e1);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = mbedtls_ssl_config_defaults(&(hi->tls).conf,0,0,0);
    if (iVar2 != 0) {
      return iVar2;
    }
    mbedtls_ssl_conf_authmode(&(hi->tls).conf,1);
    mbedtls_ssl_conf_ca_chain(&(hi->tls).conf,&(hi->tls).cacert,(mbedtls_x509_crl *)0x0);
    mbedtls_ssl_conf_rng(&(hi->tls).conf,mbedtls_ctr_drbg_random,&(hi->tls).ctr_drbg);
    mbedtls_ssl_conf_read_timeout(&(hi->tls).conf,5000);
    iVar2 = mbedtls_ssl_setup(&(hi->tls).ssl,&(hi->tls).conf);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = mbedtls_ssl_set_hostname(&(hi->tls).ssl,host);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  hi_local._4_4_ = mbedtls_net_connect_timeout(&(hi->tls).ssl_fd,host,port,0,5000);
  if (hi_local._4_4_ == 0) {
    if (BVar1 == '\x01') {
      mbedtls_ssl_set_bio(&(hi->tls).ssl,&(hi->tls).ssl_fd,mbedtls_net_send,mbedtls_net_recv,
                          mbedtls_net_recv_timeout);
      do {
        hi_local._4_4_ = mbedtls_ssl_handshake(&(hi->tls).ssl);
        if (hi_local._4_4_ == 0) {
          if (((hi->tls).verify != '\0') &&
             (uVar3 = mbedtls_ssl_get_verify_result(&(hi->tls).ssl), uVar3 != 0)) {
            return -0x2700;
          }
          goto LAB_00110486;
        }
      } while ((hi_local._4_4_ == -0x6900) || (hi_local._4_4_ == -0x6880));
    }
    else {
LAB_00110486:
      hi_local._4_4_ = 0;
    }
  }
  return hi_local._4_4_;
}

Assistant:

static int https_connect(HTTP_INFO *hi, char *host, char *port)
{
    int ret, https;


    https = hi->url.https;

    if(https == 1)
    {
        mbedtls_entropy_init( &hi->tls.entropy );

        ret = mbedtls_ctr_drbg_seed( &hi->tls.ctr_drbg, mbedtls_entropy_func, &hi->tls.entropy, NULL, 0);
        if( ret != 0 )
        {
            return ret;
        }

        ca_crt_rsa[ca_crt_rsa_size - 1] = 0;
        ret = mbedtls_x509_crt_parse(&hi->tls.cacert, (uint8_t *)ca_crt_rsa, ca_crt_rsa_size);
        if( ret != 0 )
        {
            return ret;
        }

        ret = mbedtls_ssl_config_defaults( &hi->tls.conf,
                                           MBEDTLS_SSL_IS_CLIENT,
                                           MBEDTLS_SSL_TRANSPORT_STREAM,
                                           MBEDTLS_SSL_PRESET_DEFAULT );
        if( ret != 0 )
        {
            return ret;
        }

        /* OPTIONAL is not optimal for security,
         * but makes interop easier in this simplified example */
        mbedtls_ssl_conf_authmode( &hi->tls.conf, MBEDTLS_SSL_VERIFY_OPTIONAL );
        mbedtls_ssl_conf_ca_chain( &hi->tls.conf, &hi->tls.cacert, NULL );
        mbedtls_ssl_conf_rng( &hi->tls.conf, mbedtls_ctr_drbg_random, &hi->tls.ctr_drbg );
        mbedtls_ssl_conf_read_timeout( &hi->tls.conf, 5000 );

        ret = mbedtls_ssl_setup( &hi->tls.ssl, &hi->tls.conf );
        if( ret != 0 )
        {
            return ret;
        }

        ret = mbedtls_ssl_set_hostname( &hi->tls.ssl, host );
        if( ret != 0 )
        {
            return ret;
        }
    }

    ret = mbedtls_net_connect_timeout(&hi->tls.ssl_fd, host, port, MBEDTLS_NET_PROTO_TCP, 5000);
    if( ret != 0 )
    {
        return ret;
    }

    if(https == 1)
    {
        mbedtls_ssl_set_bio(&hi->tls.ssl, &hi->tls.ssl_fd, mbedtls_net_send, mbedtls_net_recv, mbedtls_net_recv_timeout);

        while ((ret = mbedtls_ssl_handshake(&hi->tls.ssl)) != 0)
        {
            if (ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE)
            {
                return ret;
            }
        }

        /* In real life, we probably want to bail out when ret != 0 */
        if( hi->tls.verify && (mbedtls_ssl_get_verify_result(&hi->tls.ssl) != 0) )
        {
            return MBEDTLS_ERR_X509_CERT_VERIFY_FAILED;
        }
    }

    return 0;
}